

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

bool headerNameValidImpl(QLatin1StringView name)

{
  bool bVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  long in_FS_OFFSET;
  QLatin1String *this;
  QLatin1String local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_18;
  pvVar2 = QLatin1String::begin((QLatin1String *)0x1ca04b);
  pvVar3 = QLatin1String::end(this);
  bVar1 = std::all_of<char_const*,__7>(pvVar2,pvVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool headerNameValidImpl(QLatin1StringView name) noexcept
{
    return std::all_of(name.begin(), name.end(), isValidHttpHeaderNameChar);
}